

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

bool __thiscall
dg::vr::RelationsAnalyzer::mayHaveAlias(RelationsAnalyzer *this,ValueRelations *graph,V val)

{
  V from;
  bool bVar1;
  pointer ppVVar2;
  bool bVar3;
  VectorSet<const_llvm::Value_*> local_48;
  
  ValueRelations::getEqual(&local_48,graph,val);
  ppVVar2 = local_48.vec.
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = false;
  }
  else {
    do {
      from = *ppVVar2;
      bVar1 = hasKnownOrigin(graph,from);
      bVar3 = true;
      if ((!bVar1) || (bVar1 = mayHaveAlias(this,from), bVar1)) goto LAB_0011d502;
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 !=
             local_48.vec.
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    bVar3 = false;
  }
LAB_0011d502:
  if (local_48.vec.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.vec.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.vec.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool RelationsAnalyzer::mayHaveAlias(const ValueRelations &graph, V val) const {
    for (const auto *eqval : graph.getEqual(val)) {
        if (!hasKnownOrigin(graph, eqval) || mayHaveAlias(eqval))
            return true;
    }
    return false;
}